

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DialogBox.cpp
# Opt level: O0

void __thiscall gui::DialogBox::updateTitle(DialogBox *this)

{
  bool bVar1;
  element_type *peVar2;
  element_type *this_00;
  Vector2f *pVVar3;
  long in_RDI;
  float x;
  float in_stack_ffffffffffffffb8;
  float y;
  float in_stack_ffffffffffffffbc;
  Widget *in_stack_ffffffffffffffc0;
  
  bVar1 = std::operator==((shared_ptr<gui::Label> *)in_stack_ffffffffffffffc0,
                          (nullptr_t)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  if (!bVar1) {
    if (*(int *)(in_RDI + 0x270) == 0) {
      std::__shared_ptr_access<gui::Label,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<gui::Label,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x19402d);
      std::__shared_ptr_access<gui::DialogBoxStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<gui::DialogBoxStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x194043);
      std::__shared_ptr_access<gui::DialogBoxStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<gui::DialogBoxStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x194062);
      Widget::setPosition(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,
                          in_stack_ffffffffffffffb8);
    }
    else if (*(int *)(in_RDI + 0x270) == 1) {
      std::__shared_ptr_access<gui::Label,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<gui::Label,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x1940a2);
      peVar2 = std::__shared_ptr_access<gui::Label,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<gui::Label,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x1940d2);
      Label::getSize(peVar2);
      std::__shared_ptr_access<gui::DialogBoxStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<gui::DialogBoxStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x19410b);
      Widget::setPosition(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,
                          in_stack_ffffffffffffffb8);
    }
    else if (*(int *)(in_RDI + 0x270) == 2) {
      peVar2 = std::__shared_ptr_access<gui::Label,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<gui::Label,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x19414b);
      y = *(float *)(in_RDI + 0x214);
      this_00 = std::__shared_ptr_access<gui::Label,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<gui::Label,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x19416e);
      pVVar3 = Label::getSize(this_00);
      x = y - pVVar3->x;
      std::__shared_ptr_access<gui::DialogBoxStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<gui::DialogBoxStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x194196);
      std::__shared_ptr_access<gui::DialogBoxStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<gui::DialogBoxStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x1941bb);
      Widget::setPosition(&peVar2->super_Widget,x,y);
    }
  }
  return;
}

Assistant:

void DialogBox::updateTitle() {
    if (title_ == nullptr) {
        return;
    }
    if (titleAlignment_ == Alignment::left) {
        title_->setPosition(style_->titlePadding_.x, style_->titlePadding_.y);
    } else if (titleAlignment_ == Alignment::center) {
        title_->setPosition(size_.x / 2.0f - title_->getSize().x / 2.0f, style_->titlePadding_.y);
    } else if (titleAlignment_ == Alignment::right) {
        title_->setPosition(size_.x - title_->getSize().x - style_->titlePadding_.x, style_->titlePadding_.y);
    }
}